

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_crc32(uchar *data,size_t length)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  for (; 7 < length; length = length - 8) {
    uVar2 = lodepng_crc32_table6[uVar2 >> 8 & 0xff ^ (uint)data[1]] ^
            lodepng_crc32_table7[uVar2 & 0xff ^ (uint)*data] ^
            lodepng_crc32_table5[uVar2 >> 0x10 & 0xff ^ (uint)data[2]] ^
            lodepng_crc32_table4[uVar2 >> 0x18 ^ (uint)data[3]] ^ lodepng_crc32_table3[data[4]] ^
            lodepng_crc32_table2[data[5]] ^ lodepng_crc32_table1[data[6]] ^
            lodepng_crc32_table0[data[7]];
    data = data + 8;
  }
  for (uVar1 = 0; length != uVar1; uVar1 = uVar1 + 1) {
    uVar2 = uVar2 >> 8 ^ lodepng_crc32_table0[(byte)(data[uVar1] ^ (byte)uVar2)];
  }
  return ~uVar2;
}

Assistant:

unsigned lodepng_crc32(const unsigned char* data, size_t length) {
  /*Using the Slicing by Eight algorithm*/
  unsigned r = 0xffffffffu;
  while(length >= 8) {
    r = lodepng_crc32_table7[(data[0] ^ (r & 0xffu))] ^
        lodepng_crc32_table6[(data[1] ^ ((r >> 8) & 0xffu))] ^
        lodepng_crc32_table5[(data[2] ^ ((r >> 16) & 0xffu))] ^
        lodepng_crc32_table4[(data[3] ^ ((r >> 24) & 0xffu))] ^
        lodepng_crc32_table3[data[4]] ^
        lodepng_crc32_table2[data[5]] ^
        lodepng_crc32_table1[data[6]] ^
        lodepng_crc32_table0[data[7]];
    data += 8;
    length -= 8;
  }
  while(length--) {
    r = lodepng_crc32_table0[(r ^ *data++) & 0xffu] ^ (r >> 8);
  }
  return r ^ 0xffffffffu;
}